

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringImpossiblyLarge_Test::TestBody
          (BlockSizes_ReadStringImpossiblyLarge_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  char *in_R9;
  string str;
  CodedInputStream coded_input;
  ArrayInputStream input;
  AssertHelper AStack_e8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string local_c8;
  string local_a8;
  CodedInputStream local_88;
  ArrayInputStream local_38;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  ArrayInputStream::ArrayInputStream
            (&local_38,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*pPVar2);
  local_88.buffer_ = (uint8_t *)0x0;
  local_88.buffer_end_ = (uint8_t *)0x0;
  local_88._24_7_ = 0;
  local_88.overflow_bytes_._3_1_ = 0;
  local_88.last_tag_ = 0;
  local_88.legitimate_message_end_ = false;
  local_88.aliasing_enabled_ = false;
  local_88.force_eager_parsing_ = false;
  local_88.current_limit_ = 0x7fffffff;
  local_88.buffer_size_after_limit_ = 0;
  local_88.total_bytes_limit_ = 0x7fffffff;
  local_88.recursion_budget_ = CodedInputStream::default_recursion_limit_;
  local_88.recursion_limit_ = CodedInputStream::default_recursion_limit_;
  local_88.extension_pool_ = (DescriptorPool *)0x0;
  local_88.extension_factory_ = (MessageFactory *)0x0;
  local_88.input_ = &local_38.super_ZeroCopyInputStream;
  CodedInputStream::Refresh(&local_88);
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar1 = CodedInputStream::ReadString(&local_88,&local_a8,0x40000000);
  local_d8[0] = (internal)!bVar1;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,local_d8,(AssertionResult *)"coded_input.ReadString(&str, 1 << 30)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x311,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_e0._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  CodedInputStream::~CodedInputStream(&local_88);
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringImpossiblyLarge) {
  int kBlockSizes_case = GetParam();
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    std::string str;
    // Try to read a gigabyte.
    EXPECT_FALSE(coded_input.ReadString(&str, 1 << 30));
  }
}